

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ckh.c
# Opt level: O0

_Bool duckdb_je_ckh_iter(ckh_t *ckh,size_t *tabind,void **key,void **data)

{
  size_t ncells;
  size_t i;
  void **data_local;
  void **key_local;
  size_t *tabind_local;
  ckh_t *ckh_local;
  
  i = *tabind;
  while( true ) {
    if ((ulong)(1L << ((char)ckh->lg_curbuckets + 2U & 0x3f)) <= i) {
      return true;
    }
    if (ckh->tab[i].key != (void *)0x0) break;
    i = i + 1;
  }
  if (key != (void **)0x0) {
    *key = ckh->tab[i].key;
  }
  if (data != (void **)0x0) {
    *data = ckh->tab[i].data;
  }
  *tabind = i + 1;
  return false;
}

Assistant:

bool
ckh_iter(ckh_t *ckh, size_t *tabind, void **key, void **data) {
	size_t i, ncells;

	for (i = *tabind, ncells = (ZU(1) << (ckh->lg_curbuckets +
	    LG_CKH_BUCKET_CELLS)); i < ncells; i++) {
		if (ckh->tab[i].key != NULL) {
			if (key != NULL) {
				*key = (void *)ckh->tab[i].key;
			}
			if (data != NULL) {
				*data = (void *)ckh->tab[i].data;
			}
			*tabind = i + 1;
			return false;
		}
	}

	return true;
}